

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O0

TestStatus *
vkt::wsi::anon_unknown_0::basicRenderTest
          (TestStatus *__return_storage_ptr__,Context *context,Type wsiType)

{
  Vector<unsigned_int,_2> *this;
  undefined1 *this_00;
  VkAllocationCallbacks **vk;
  pointer *this_01;
  VkInstance pVVar1;
  VkDevice device_00;
  ulong numFences;
  RefData<vk::Handle<(vk::HandleType)25>_> data;
  RefData<vk::Handle<(vk::HandleType)26>_> data_00;
  RefData<vk::Handle<(vk::HandleType)24>_> data_01;
  GetPastPresentationTimingGOOGLEFunc p_Var2;
  VkResult VVar3;
  deBool dVar4;
  VkInstance_s **ppVVar5;
  Display *nativeDisplay;
  Window *nativeWindow;
  Handle<(vk::HandleType)25> *pHVar6;
  VkDevice_s **ppVVar7;
  Handle<(vk::HandleType)26> *pHVar8;
  ProgramCollection<vk::ProgramBinary> *binaryRegistry;
  size_type sVar9;
  Handle<(vk::HandleType)24> *pHVar10;
  ulong uVar11;
  const_reference this_02;
  RefBase<vk::Handle<(vk::HandleType)6>_> *this_03;
  Handle<(vk::HandleType)6> *pHVar12;
  const_reference pvVar13;
  RefBase<vk::Handle<(vk::HandleType)4>_> *pRVar14;
  Handle<(vk::HandleType)4> *pHVar15;
  void *pvVar16;
  TestContext *this_04;
  TestLog *this_05;
  MessageBuilder *pMVar17;
  TestError *this_06;
  const_reference this_07;
  RefBase<vk::VkCommandBuffer_s_*> *this_08;
  VkCommandBuffer_s **ppVVar18;
  VkCommandPool commandPool_00;
  undefined8 extraout_RDX;
  undefined8 uVar19;
  undefined8 extraout_RDX_00;
  VkSystemAllocationScope VVar20;
  Handle<(vk::HandleType)6> HVar21;
  allocator<char> local_10f1;
  string local_10f0;
  Handle<(vk::HandleType)6> local_10d0;
  undefined4 local_10c8 [2];
  VkPresentInfoKHR presentInfo;
  VkSubmitInfo submitInfo;
  VkCommandBuffer_s *pVStack_1038;
  VkPipelineStageFlags waitDstStage;
  VkCommandBuffer commandBuffer;
  VkSemaphore renderingCompleteSemaphore;
  VkResult local_e90;
  undefined1 local_e8c [4];
  VkResult acquireResult;
  deUint32 imageNdx;
  VkSemaphore imageReadySemaphore;
  VkFence imageReadyFence;
  deUint32 frameNdx;
  deUint32 numFramesToRender;
  undefined1 local_e68 [8];
  vector<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
  commandBuffers;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  renderingCompleteSemaphores;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  imageReadySemaphores;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
  imageReadyFences;
  size_t maxQueuedFrames;
  RefData<vk::Handle<(vk::HandleType)24>_> local_de0;
  undefined1 local_dc0 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> commandPool;
  vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_> local_d98;
  undefined1 local_d80 [8];
  TriangleRenderer renderer;
  undefined1 local_c90 [8];
  vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
  swapchainImages;
  RefData<vk::Handle<(vk::HandleType)26>_> local_c58;
  undefined1 local_c38 [8];
  Unique<vk::Handle<(vk::HandleType)26>_> swapchain;
  undefined1 local_c10 [8];
  VkSwapchainCreateInfoKHR swapchainInfo;
  undefined1 local_9a0 [8];
  SimpleAllocator allocator;
  VkDevice device;
  DeviceInterface *vkd;
  undefined1 local_768 [8];
  DeviceHelper devHelper;
  RefData<vk::Handle<(vk::HandleType)25>_> local_260;
  undefined1 local_240 [8];
  Unique<vk::Handle<(vk::HandleType)25>_> surface;
  Maybe<tcu::Vector<unsigned_int,_2>_> local_210;
  undefined1 local_200 [8];
  NativeObjects native;
  InstanceHelper instHelper;
  UVec2 desiredSize;
  Type wsiType_local;
  Context *context_local;
  
  this = (Vector<unsigned_int,_2> *)
         ((long)&instHelper.vki.m_vk.getPhysicalDeviceGeneratedCommandsPropertiesNVX + 4);
  tcu::Vector<unsigned_int,_2>::Vector(this,0x100,0x100);
  this_00 = &native.window.super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.
             m_data.field_0x8;
  InstanceHelper::InstanceHelper
            ((InstanceHelper *)this_00,context,wsiType,(VkAllocationCallbacks *)0x0);
  tcu::just<tcu::Vector<unsigned_int,2>>((tcu *)&local_210,this);
  NativeObjects::NativeObjects
            ((NativeObjects *)local_200,context,(Extensions *)this_00,wsiType,&local_210);
  tcu::Maybe<tcu::Vector<unsigned_int,_2>_>::~Maybe(&local_210);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkInstance_s_*>::operator*
                      ((RefBase<vk::VkInstance_s_*> *)
                       &instHelper.supportedExtensions.
                        super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pVVar1 = *ppVVar5;
  nativeDisplay =
       de::details::UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>::operator*
                 ((UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_> *)local_200);
  nativeWindow = de::details::UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>::
                 operator*((UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_> *)
                           &native.display.
                            super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>
                            .m_data.field_0x8);
  ::vk::wsi::createSurface
            ((Move<vk::Handle<(vk::HandleType)25>_> *)&devHelper.queue,
             (InstanceInterface *)
             &instHelper.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator,
             pVVar1,wsiType,nativeDisplay,nativeWindow,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_260,(Move *)&devHelper.queue);
  data.deleter.m_instanceIface = local_260.deleter.m_instanceIface;
  data.object.m_internal = local_260.object.m_internal;
  data.deleter.m_instance = local_260.deleter.m_instance;
  data.deleter.m_allocator = local_260.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)25>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)25>_> *)local_240,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)25>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)25>_> *)&devHelper.queue);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkInstance_s_*>::operator*
                      ((RefBase<vk::VkInstance_s_*> *)
                       &instHelper.supportedExtensions.
                        super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pVVar1 = *ppVVar5;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)25>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)25>_> *)local_240);
  DeviceHelper::DeviceHelper
            ((DeviceHelper *)local_768,context,
             (InstanceInterface *)
             &instHelper.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator,
             pVVar1,(VkSurfaceKHR)pHVar6->m_internal,(VkAllocationCallbacks *)0x0);
  vk = &devHelper.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator;
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                      ((RefBase<vk::VkDevice_s_*> *)&devHelper.queueFamilyIndex);
  device_00 = *ppVVar7;
  allocator.m_memProps.memoryHeaps[0xf]._8_8_ = device_00;
  ::vk::getPhysicalDeviceMemoryProperties
            ((VkPhysicalDeviceMemoryProperties *)&swapchainInfo.oldSwapchain,
             (InstanceInterface *)
             &instHelper.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator,
             (VkPhysicalDevice)local_768);
  ::vk::SimpleAllocator::SimpleAllocator
            ((SimpleAllocator *)local_9a0,(DeviceInterface *)vk,device_00,
             (VkPhysicalDeviceMemoryProperties *)&swapchainInfo.oldSwapchain);
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)25>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)25>_> *)local_240);
  swapchain.super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar6->m_internal;
  getBasicSwapchainParameters
            ((VkSwapchainCreateInfoKHR *)local_c10,wsiType,
             (InstanceInterface *)
             &instHelper.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator,
             (VkPhysicalDevice)local_768,
             (VkSurfaceKHR)
             swapchain.super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.deleter.m_allocator,
             (UVec2 *)((long)&instHelper.vki.m_vk.getPhysicalDeviceGeneratedCommandsPropertiesNVX +
                      4),2);
  ::vk::createSwapchainKHR
            ((Move<vk::Handle<(vk::HandleType)26>_> *)
             &swapchainImages.
              super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(DeviceInterface *)vk,
             (VkDevice)allocator.m_memProps.memoryHeaps[0xf]._8_8_,
             (VkSwapchainCreateInfoKHR *)local_c10,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_c58,
             (Move *)&swapchainImages.
                      super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  data_00.deleter.m_deviceIface = local_c58.deleter.m_deviceIface;
  data_00.object.m_internal = local_c58.object.m_internal;
  data_00.deleter.m_device = local_c58.deleter.m_device;
  data_00.deleter.m_allocator = local_c58.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)26>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)26>_> *)local_c38,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)26>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)26>_> *)
             &swapchainImages.
              super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  uVar19 = allocator.m_memProps.memoryHeaps[0xf]._8_8_;
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)26>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)26>_> *)local_c38);
  renderer.m_framebuffers.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pHVar8->m_internal;
  ::vk::wsi::getSwapchainImages
            ((vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
              *)local_c90,(DeviceInterface *)vk,(VkDevice)uVar19,
             (VkSwapchainKHR)
             renderer.m_framebuffers.
             super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  uVar19 = allocator.m_memProps.memoryHeaps[0xf]._8_8_;
  binaryRegistry = Context::getBinaryCollection(context);
  std::vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>::
  vector(&local_d98,
         (vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_> *)
         local_c90);
  tcu::Vector<unsigned_int,_2>::Vector
            ((Vector<unsigned_int,_2> *)
             &commandPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator,
             swapchainInfo.imageFormat,swapchainInfo.imageColorSpace);
  TriangleRenderer::TriangleRenderer
            ((TriangleRenderer *)local_d80,(DeviceInterface *)vk,(VkDevice)uVar19,
             (Allocator *)local_9a0,binaryRegistry,&local_d98,swapchainInfo.surface.m_internal._4_4_
             ,(UVec2 *)&commandPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                        m_allocator);
  std::vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>::
  ~vector(&local_d98);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&maxQueuedFrames,(DeviceInterface *)vk,
             (VkDevice)allocator.m_memProps.memoryHeaps[0xf]._8_8_,2,
             (deUint32)devHelper.physicalDevice,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_de0,(Move *)&maxQueuedFrames);
  data_01.deleter.m_deviceIface = local_de0.deleter.m_deviceIface;
  data_01.object.m_internal = local_de0.object.m_internal;
  data_01.deleter.m_device = local_de0.deleter.m_device;
  data_01.deleter.m_allocator = local_de0.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_dc0,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&maxQueuedFrames);
  sVar9 = std::
          vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>::
          size((vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                *)local_c90);
  numFences = sVar9 * 2;
  createFences((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
                *)&imageReadySemaphores.
                   super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,(DeviceInterface *)vk,
               (VkDevice)allocator.m_memProps.memoryHeaps[0xf]._8_8_,numFences);
  createSemaphores((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                    *)&renderingCompleteSemaphores.
                       super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,(DeviceInterface *)vk,
                   (VkDevice)allocator.m_memProps.memoryHeaps[0xf]._8_8_,numFences + 1);
  createSemaphores((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                    *)&commandBuffers.
                       super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,(DeviceInterface *)vk,
                   (VkDevice)allocator.m_memProps.memoryHeaps[0xf]._8_8_,numFences);
  uVar19 = allocator.m_memProps.memoryHeaps[0xf]._8_8_;
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_dc0);
  commandPool_00.m_internal = pHVar10->m_internal;
  HVar21.m_internal = 0;
  allocateCommandBuffers
            ((vector<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
              *)local_e68,(DeviceInterface *)vk,(VkDevice)uVar19,commandPool_00,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY,numFences);
  imageReadyFence.m_internal._4_4_ = 600;
  imageReadyFence.m_internal._0_4_ = 0;
  uVar19 = extraout_RDX;
  do {
    VVar20 = (VkSystemAllocationScope)HVar21.m_internal;
    if (599 < (uint)imageReadyFence.m_internal) {
      VVar3 = (*(devHelper.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator)->
                pfnInternalAllocation)
                        (vk,allocator.m_memProps.memoryHeaps[0xf]._8_8_,
                         (VkInternalAllocationType)uVar19,
                         (VkSystemAllocationScope)commandPool_00.m_internal);
      ::vk::checkResult(VVar3,"vkd.deviceWaitIdle(device)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                        ,0x599);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_10f0,"Rendering tests succeeded",&local_10f1);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_10f0);
      std::__cxx11::string::~string((string *)&local_10f0);
      std::allocator<char>::~allocator(&local_10f1);
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
      ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
                 *)local_e68);
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
      ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                 *)&commandBuffers.
                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
      ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                 *)&renderingCompleteSemaphores.
                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
      ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
                 *)&imageReadySemaphores.
                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_dc0);
      TriangleRenderer::~TriangleRenderer((TriangleRenderer *)local_d80);
      std::vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>::
      ~vector((vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
               *)local_c90);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)26>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)26>_> *)local_c38);
      ::vk::SimpleAllocator::~SimpleAllocator((SimpleAllocator *)local_9a0);
      DeviceHelper::~DeviceHelper((DeviceHelper *)local_768);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)25>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)25>_> *)local_240);
      NativeObjects::~NativeObjects((NativeObjects *)local_200);
      InstanceHelper::~InstanceHelper
                ((InstanceHelper *)
                 &native.window.
                  super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.m_data.
                  field_0x8);
      return __return_storage_ptr__;
    }
    uVar11 = (ulong)(uint)imageReadyFence.m_internal;
    sVar9 = std::
            vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
            ::size((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
                    *)&imageReadySemaphores.
                       super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    this_02 = std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
              ::operator[]((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
                            *)&imageReadySemaphores.
                               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,uVar11 % sVar9);
    this_03 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>::operator*
                         (this_02)->super_RefBase<vk::Handle<(vk::HandleType)6>_>;
    pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::operator*(this_03);
    imageReadySemaphore.m_internal = pHVar12->m_internal;
    uVar11 = (ulong)(uint)imageReadyFence.m_internal;
    sVar9 = std::
            vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
            ::size((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                    *)&renderingCompleteSemaphores.
                       super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pvVar13 = std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
              ::operator[]((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                            *)&renderingCompleteSemaphores.
                               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,uVar11 % sVar9);
    pRVar14 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>::operator*
                         (pvVar13)->super_RefBase<vk::Handle<(vk::HandleType)4>_>;
    pHVar15 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::operator*(pRVar14);
    uVar19 = allocator.m_memProps.memoryHeaps[0xf]._8_8_;
    _acquireResult = pHVar15->m_internal;
    local_e8c = (undefined1  [4])0xffffffff;
    if (numFences <= (uint)imageReadyFence.m_internal) {
      std::numeric_limits<unsigned_long>::max();
      VVar20 = VK_SYSTEM_ALLOCATION_SCOPE_OBJECT;
      VVar3 = (*devHelper.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator[3].
                pfnInternalAllocation)
                        (vk,uVar19,VK_INTERNAL_ALLOCATION_TYPE_LAST,
                         (VkSystemAllocationScope)&imageReadySemaphore);
      ::vk::checkResult(VVar3,
                        "vkd.waitForFences(device, 1u, &imageReadyFence, VK_TRUE, std::numeric_limits<deUint64>::max())"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                        ,0x563);
    }
    pvVar16 = (*devHelper.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator[3].
                pfnReallocation)(vk,(void *)allocator.m_memProps.memoryHeaps[0xf]._8_8_,1,
                                 (size_t)&imageReadySemaphore,VVar20);
    ::vk::checkResult((VkResult)pvVar16,"vkd.resetFences(device, 1, &imageReadyFence)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                      ,0x565);
    uVar19 = allocator.m_memProps.memoryHeaps[0xf]._8_8_;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)26>_>::operator*
              ((RefBase<vk::Handle<(vk::HandleType)26>_> *)local_c38);
    std::numeric_limits<unsigned_long>::max();
    local_e90 = (*devHelper.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator[0x14].
                  pfnFree)(vk,(void *)uVar19);
    if (local_e90 == VK_SUBOPTIMAL_KHR) {
      this_04 = Context::getTestContext(context);
      this_05 = tcu::TestContext::getLog(this_04);
      tcu::TestLog::operator<<
                ((MessageBuilder *)&renderingCompleteSemaphore,this_05,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar17 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)&renderingCompleteSemaphore,(char (*) [5])0x13741ef);
      pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,&local_e90);
      pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,(char (*) [11])" at frame ");
      pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,(uint *)&imageReadyFence);
      tcu::MessageBuilder::operator<<(pMVar17,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&renderingCompleteSemaphore);
    }
    else {
      ::vk::checkResult(local_e90,"acquireResult",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                        ,0x572);
    }
    do {
      dVar4 = ::deGetFalse();
      if ((dVar4 != 0) ||
         (uVar11 = (ulong)(uint)local_e8c,
         sVar9 = std::
                 vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                 ::size((vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                         *)local_c90), sVar9 <= uVar11)) {
        this_06 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_06,(char *)0x0,"(size_t)imageNdx < swapchainImages.size()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                   ,0x575);
        __cxa_throw(this_06,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    uVar11 = (ulong)(uint)imageReadyFence.m_internal;
    this_01 = &commandBuffers.
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    sVar9 = std::
            vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
            ::size((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                    *)this_01);
    pvVar13 = std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
              ::operator[]((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                            *)this_01,uVar11 % sVar9);
    pRVar14 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>::operator*
                         (pvVar13)->super_RefBase<vk::Handle<(vk::HandleType)4>_>;
    pHVar15 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::operator*(pRVar14);
    commandBuffer = (VkCommandBuffer)pHVar15->m_internal;
    uVar11 = (ulong)(uint)imageReadyFence.m_internal;
    sVar9 = std::
            vector<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
            ::size((vector<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
                    *)local_e68);
    this_07 = std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
              ::operator[]((vector<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
                            *)local_e68,uVar11 % sVar9);
    this_08 = &de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>::operator*(this_07)->
               super_RefBase<vk::VkCommandBuffer_s_*>;
    ppVVar18 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*(this_08);
    pVStack_1038 = *ppVVar18;
    submitInfo.pSignalSemaphores._4_4_ = 0x400;
    presentInfo.pResults._0_4_ = 4;
    submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    submitInfo._4_4_ = 0;
    submitInfo.pNext._0_4_ = 1;
    submitInfo._16_8_ = &acquireResult;
    submitInfo.pWaitSemaphores = (VkSemaphore *)((long)&submitInfo.pSignalSemaphores + 4);
    submitInfo.pWaitDstStageMask._0_4_ = 1;
    submitInfo._40_8_ = &stack0xffffffffffffefc8;
    submitInfo.pCommandBuffers._0_4_ = 1;
    presentInfo._16_8_ = &commandBuffer;
    local_10c8[0] = 0x3b9acde9;
    presentInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    presentInfo._4_4_ = 0;
    presentInfo.pNext._0_4_ = 1;
    presentInfo.pWaitSemaphores._0_4_ = 1;
    submitInfo._56_8_ = presentInfo._16_8_;
    presentInfo._32_8_ =
         ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)26>_>::operator*
                   ((RefBase<vk::Handle<(vk::HandleType)26>_> *)local_c38);
    presentInfo.pSwapchains = (VkSwapchainKHR *)local_e8c;
    presentInfo.pImageIndices = (deUint32 *)0x0;
    TriangleRenderer::recordFrame
              ((TriangleRenderer *)local_d80,pVStack_1038,(deUint32)local_e8c,
               (uint)imageReadyFence.m_internal);
    p_Var2 = devHelper.vkd.m_vk.getPastPresentationTimingGOOGLE;
    ::vk::Handle<(vk::HandleType)6>::Handle(&local_10d0,0);
    HVar21.m_internal = local_10d0.m_internal;
    pvVar16 = (*(devHelper.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator)->
                pfnReallocation)(vk,p_Var2,1,(size_t)&presentInfo.pResults,
                                 (VkSystemAllocationScope)local_10d0.m_internal);
    VVar20 = 0x594;
    ::vk::checkResult((VkResult)pvVar16,
                      "vkd.queueSubmit(devHelper.queue, 1u, &submitInfo, (VkFence)0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                      ,0x594);
    VVar3 = (*devHelper.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator[0x14].
              pfnInternalAllocation)
                      (vk,(size_t)devHelper.vkd.m_vk.getPastPresentationTimingGOOGLE,
                       (VkInternalAllocationType)local_10c8,VVar20);
    commandPool_00.m_internal = 0x595;
    ::vk::checkResult(VVar3,"vkd.queuePresentKHR(devHelper.queue, &presentInfo)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                      ,0x595);
    imageReadyFence.m_internal._0_4_ = (uint)imageReadyFence.m_internal + 1;
    uVar19 = extraout_RDX_00;
  } while( true );
}

Assistant:

tcu::TestStatus basicRenderTest (Context& context, Type wsiType)
{
	const tcu::UVec2				desiredSize					(256, 256);
	const InstanceHelper			instHelper					(context, wsiType);
	const NativeObjects				native						(context, instHelper.supportedExtensions, wsiType, tcu::just(desiredSize));
	const Unique<VkSurfaceKHR>		surface						(createSurface(instHelper.vki, *instHelper.instance, wsiType, *native.display, *native.window));
	const DeviceHelper				devHelper					(context, instHelper.vki, *instHelper.instance, *surface);
	const DeviceInterface&			vkd							= devHelper.vkd;
	const VkDevice					device						= *devHelper.device;
	SimpleAllocator					allocator					(vkd, device, getPhysicalDeviceMemoryProperties(instHelper.vki, devHelper.physicalDevice));
	const VkSwapchainCreateInfoKHR	swapchainInfo				= getBasicSwapchainParameters(wsiType, instHelper.vki, devHelper.physicalDevice, *surface, desiredSize, 2);
	const Unique<VkSwapchainKHR>	swapchain					(createSwapchainKHR(vkd, device, &swapchainInfo));
	const vector<VkImage>			swapchainImages				= getSwapchainImages(vkd, device, *swapchain);

	const TriangleRenderer			renderer					(vkd,
																 device,
																 allocator,
																 context.getBinaryCollection(),
																 swapchainImages,
																 swapchainInfo.imageFormat,
																 tcu::UVec2(swapchainInfo.imageExtent.width, swapchainInfo.imageExtent.height));

	const Unique<VkCommandPool>		commandPool					(createCommandPool(vkd, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, devHelper.queueFamilyIndex));

	const size_t					maxQueuedFrames				= swapchainImages.size()*2;

	// We need to keep hold of fences from vkAcquireNextImageKHR to actually
	// limit number of frames we allow to be queued.
	const vector<FenceSp>			imageReadyFences			(createFences(vkd, device, maxQueuedFrames));

	// We need maxQueuedFrames+1 for imageReadySemaphores pool as we need to pass
	// the semaphore in same time as the fence we use to meter rendering.
	const vector<SemaphoreSp>		imageReadySemaphores		(createSemaphores(vkd, device, maxQueuedFrames+1));

	// For rest we simply need maxQueuedFrames as we will wait for image
	// from frameNdx-maxQueuedFrames to become available to us, guaranteeing that
	// previous uses must have completed.
	const vector<SemaphoreSp>		renderingCompleteSemaphores	(createSemaphores(vkd, device, maxQueuedFrames));
	const vector<CommandBufferSp>	commandBuffers				(allocateCommandBuffers(vkd, device, *commandPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY, maxQueuedFrames));

	try
	{
		const deUint32	numFramesToRender	= 60*10;

		for (deUint32 frameNdx = 0; frameNdx < numFramesToRender; ++frameNdx)
		{
			const VkFence		imageReadyFence		= **imageReadyFences[frameNdx%imageReadyFences.size()];
			const VkSemaphore	imageReadySemaphore	= **imageReadySemaphores[frameNdx%imageReadySemaphores.size()];
			deUint32			imageNdx			= ~0u;

			if (frameNdx >= maxQueuedFrames)
				VK_CHECK(vkd.waitForFences(device, 1u, &imageReadyFence, VK_TRUE, std::numeric_limits<deUint64>::max()));

			VK_CHECK(vkd.resetFences(device, 1, &imageReadyFence));

			{
				const VkResult	acquireResult	= vkd.acquireNextImageKHR(device,
																		  *swapchain,
																		  std::numeric_limits<deUint64>::max(),
																		  imageReadySemaphore,
																		  imageReadyFence,
																		  &imageNdx);

				if (acquireResult == VK_SUBOPTIMAL_KHR)
					context.getTestContext().getLog() << TestLog::Message << "Got " << acquireResult << " at frame " << frameNdx << TestLog::EndMessage;
				else
					VK_CHECK(acquireResult);
			}

			TCU_CHECK((size_t)imageNdx < swapchainImages.size());

			{
				const VkSemaphore			renderingCompleteSemaphore	= **renderingCompleteSemaphores[frameNdx%renderingCompleteSemaphores.size()];
				const VkCommandBuffer		commandBuffer				= **commandBuffers[frameNdx%commandBuffers.size()];
				const VkPipelineStageFlags	waitDstStage				= VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT;
				const VkSubmitInfo			submitInfo					=
				{
					VK_STRUCTURE_TYPE_SUBMIT_INFO,
					DE_NULL,
					1u,
					&imageReadySemaphore,
					&waitDstStage,
					1u,
					&commandBuffer,
					1u,
					&renderingCompleteSemaphore
				};
				const VkPresentInfoKHR		presentInfo					=
				{
					VK_STRUCTURE_TYPE_PRESENT_INFO_KHR,
					DE_NULL,
					1u,
					&renderingCompleteSemaphore,
					1u,
					&*swapchain,
					&imageNdx,
					(VkResult*)DE_NULL
				};

				renderer.recordFrame(commandBuffer, imageNdx, frameNdx);
				VK_CHECK(vkd.queueSubmit(devHelper.queue, 1u, &submitInfo, (VkFence)0));
				VK_CHECK(vkd.queuePresentKHR(devHelper.queue, &presentInfo));
			}
		}

		VK_CHECK(vkd.deviceWaitIdle(device));
	}
	catch (...)
	{
		// Make sure device is idle before destroying resources
		vkd.deviceWaitIdle(device);
		throw;
	}

	return tcu::TestStatus::pass("Rendering tests succeeded");
}